

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildReturn(CNscPStackEntry *pReturn)

{
  NscSymbolFence *pNVar1;
  CNscPStackEntry *this;
  NscSymbolFence **ppNVar2;
  NscType nType;
  NscMessage nMessage;
  NscType NVar3;
  uchar *pauchData;
  size_t nDataSize;
  
  this = CNscContext::GetPStackEntryInt(g_pCtx);
  if ((g_pCtx->m_fPhase2 == false) && (g_pCtx->m_fNWScript == false)) {
    if (pReturn != (CNscPStackEntry *)0x0) {
      CNwnDoubleLinkList::InsertAfter(&pReturn->m_link,&g_pCtx->m_listEntryFree);
    }
    CNscPStackEntry::SetType(this,NscType_Unknown);
    return this;
  }
  if (pReturn == (CNscPStackEntry *)0x0) {
    nDataSize = 0;
    pauchData = (uchar *)0x0;
    nType = NscType_Unknown;
  }
  else {
    nType = pReturn->m_nType;
    if (nType == NscType_Error) {
      CNscPStackEntry::SetType(this,NscType_Error);
      goto LAB_0015e9f1;
    }
    pauchData = pReturn->m_pauchData;
    nDataSize = pReturn->m_nDataSize;
    if (nDataSize == 0) {
      nType = NscType_Unknown;
    }
  }
  ppNVar2 = &g_pCtx->m_pCurrentFence;
  do {
    pNVar1 = *ppNVar2;
    if (pNVar1 == (NscSymbolFence *)0x0) {
      nMessage = NscMessage_ErrorReturnOutsideFunction;
      goto LAB_0015e9b2;
    }
    ppNVar2 = &pNVar1->pNext;
  } while (pNVar1->nFnSymbol == 0);
  NVar3 = *(NscType *)((g_pCtx->m_sSymbols).m_pauchData + pNVar1->nFnSymbol + 0x20);
  if ((((nType == NscType_Unknown) &&
       (nMessage = NscMessage_ErrorReturnValueExpected, NVar3 != NscType_Void)) ||
      ((nType != NscType_Unknown &&
       (nMessage = NscMessage_ErrorReturnValueIllegalOnVoidFn, NVar3 == NscType_Void)))) ||
     ((nType != NVar3 && (nMessage = NscMessage_ErrorTypeMismatchOnReturn, NVar3 != NscType_Void))))
  {
LAB_0015e9b2:
    CNscContext::GenerateMessage(g_pCtx,nMessage);
  }
  CNscPStackEntry::PushReturn(this,nType,pauchData,nDataSize);
  NVar3 = NscType_Unknown;
  if (g_pCtx->m_fOptReturn == false) {
    NVar3 = nType;
  }
  CNscPStackEntry::SetType(this,NVar3);
  NscSetFenceReturn(true);
  if (pReturn == (CNscPStackEntry *)0x0) {
    return this;
  }
LAB_0015e9f1:
  CNwnDoubleLinkList::InsertAfter(&pReturn->m_link,&g_pCtx->m_listEntryFree);
  return this;
}

Assistant:

YYSTYPE NscBuildReturn (YYSTYPE pReturn)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);

	//
	// If this is phase1 and we are in a function, do nothing
	//

	if (!g_pCtx ->IsPhase2 () && !g_pCtx ->IsNWScript ())
	{
		if (pReturn)
			g_pCtx ->FreePStackEntry (pReturn);
		pOut ->SetType (NscType_Unknown);
		return pOut;
	}

	//
	// Check for silent errors
	//

	if (pReturn != NULL && pReturn ->GetType () == NscType_Error)
	{
		pOut ->SetType (NscType_Error);
	}

	//
	// Otherwise, normal processing
	//

	else
	{

		//
		// Get the data
		//

		unsigned char *pauchData = NULL;
		size_t nDataSize = 0;
		if (pReturn)
		{
			pauchData = pReturn ->GetData ();
			nDataSize = pReturn ->GetDataSize ();
		} 

		//
		// Get the return type
		//

		NscType nType;
		if (nDataSize > 0)
			nType = pReturn ->GetType ();
		else
			nType = NscType_Unknown;

		//
		// Get the return type of the function
		//

		NscSymbolFence *pFence = g_pCtx ->GetCurrentFence ();
		while (pFence && pFence ->nFnSymbol == 0)
			pFence = pFence ->pNext;
		if (pFence)
		{
			NscSymbol *pSymbol = g_pCtx ->GetSymbol (pFence ->nFnSymbol);
			if (pSymbol ->nType != NscType_Void && nType == NscType_Unknown)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorReturnValueExpected);
			}
			else if (pSymbol ->nType == NscType_Void && nType != NscType_Unknown)
			{
				g_pCtx ->GenerateMessage (
					NscMessage_ErrorReturnValueIllegalOnVoidFn);
			}
			else if (pSymbol ->nType != NscType_Void && nType != pSymbol ->nType)
			{
				g_pCtx ->GenerateMessage (NscMessage_ErrorTypeMismatchOnReturn);
			}
		}
		else
		{
			g_pCtx ->GenerateMessage (NscMessage_ErrorReturnOutsideFunction);
		}

		//
		// Push the return
		//

		pOut ->PushReturn (nType, pauchData, nDataSize);
		if (g_pCtx ->GetOptReturn ())
        	pOut ->SetType (NscType_Unknown);
		else
        	pOut ->SetType (nType);

		//
		// Set the fence
		//

		NscSetFenceReturn (true);
	}

	//
	// Return results
	//

	if (pReturn)
        g_pCtx ->FreePStackEntry (pReturn);
	return pOut;
}